

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void drawGui(void)

{
  cgltf_extras *ptr_id;
  cgltf_animation_path_type t;
  cgltf_scene *pcVar1;
  cgltf_morph_target *pcVar2;
  cgltf_texture *pcVar3;
  FmtBuffer *buffer;
  unsigned_long *puVar4;
  cgltf_node **ptr_id_00;
  cgltf_node *pcVar5;
  cgltf_animation *pcVar6;
  cgltf_animation_channel *pcVar7;
  cgltf_data *pcVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  cgltf_size cVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  char **ppcVar16;
  char (*xs) [2];
  u8 *puVar17;
  char (*x) [3];
  char (*x_00) [3];
  cgltf_mesh *pcVar18;
  cgltf_primitive *ptr_id_01;
  cgltf_morph_target *ptr_id_02;
  cgltf_attribute *pcVar19;
  cgltf_sampler **ptr_id_03;
  cgltf_image *pcVar20;
  cgltf_sampler *pcVar21;
  cgltf_skin *pcVar22;
  cgltf_accessor *pcVar23;
  cgltf_material *material;
  cgltf_camera *ptr_id_04;
  size_t i_2;
  cgltf_buffer *pcVar24;
  ulong uVar25;
  cgltf_mesh *x_02;
  cgltf_float *pcVar26;
  char (*in_R8) [2];
  long lVar27;
  cgltf_size cVar28;
  cgltf_image *ptr_id_05;
  cgltf_buffer_view_type *pcVar29;
  undefined8 *puVar30;
  size_t i;
  ImVec2 x_03;
  FmtBuffer *pFVar31;
  ImVec2 IVar32;
  ulong uVar33;
  u64 uVar34;
  unsigned_long *x_04;
  cgltf_buffer *pcVar35;
  size_t i_1;
  long lVar36;
  ImVec2 IVar37;
  cgltf_skin *pcVar38;
  undefined4 uVar39;
  float fVar40;
  CStr str;
  CStr str_00;
  CStr str_01;
  CStr str_02;
  CStr str_03;
  CStr str_04;
  CStr str_05;
  CStr str_06;
  Span<char> buffer_00;
  Span<char> buffer_01;
  Span<char> buffer_02;
  Span<char> buffer_03;
  Span<char> buffer_04;
  Span<char> buffer_05;
  size_t requiredMem;
  undefined1 local_a0 [8];
  undefined8 uStack_98;
  uint local_90;
  cgltf_skin *local_88;
  undefined1 local_80 [24];
  cgltf_buffer *local_68;
  cgltf_mesh *local_60;
  cgltf_mesh *local_58;
  cgltf_mesh *local_50;
  cgltf_mesh *local_48;
  CStrT<char> local_40;
  unsigned_long *x_01;
  
  if (parsedData == (cgltf_data *)0x0) {
    ImGui::Begin("drag & drop a glTF file##0",(bool *)0x0,0);
    ImGui::End();
    return;
  }
  local_a0._0_4_ = 1.0;
  local_a0._4_4_ = 1.0;
  ImGui::PushStyleVar(1,(ImVec2 *)local_a0);
  pcVar13 = (char *)(ulong)(uint)scratch._size;
  local_a0 = (undefined1  [8])scratch._data;
  uStack_98 = scratch._data;
  local_90 = (uint)scratch._size;
  tl::CStrT<char>::CStrT(&local_40,&openedFilePath);
  str._str = pcVar13;
  str._0_8_ = local_40._str;
  tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(ulong)local_40._size,str);
  tl::CStrT<char>::CStrT((CStrT<char> *)local_80,"##0");
  str_00._str = pcVar13;
  str_00._0_8_ = local_80._8_8_;
  tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(local_80._0_8_ & 0xffffffff),str_00);
  uStack_98[-(ulong)(local_90 == 0)] = '\0';
  ImGui::Begin((char *)scratch._data,(bool *)0x0,0);
  ImGui::PopStyleVar(1);
  bVar9 = ImGui::BeginTabBar("TopTabBar",0);
  if (bVar9) {
    bVar9 = ImGui::BeginTabItem("Scenes",(bool *)0x0,0);
    if (bVar9) {
      if (drawGui_scenesTab()::rightPanelSize == '\0') {
        drawGui();
      }
      IVar32 = ImGui::GetWindowSize();
      drawGui_scenesTab()::leftPanelSize = drawGui_scenesTab()::leftPanelSize * IVar32.x;
      drawGui_scenesTab()::rightPanelSize = IVar32.x * drawGui_scenesTab()::rightPanelSize;
      Splitter(true,4.0,&drawGui_scenesTab()::leftPanelSize,&drawGui_scenesTab()::rightPanelSize,0.0
               ,0.0,-1.0);
      local_a0._0_4_ = 4.0;
      local_a0._4_4_ = 4.0;
      ImGui::PushStyleVar(0xd,(ImVec2 *)local_a0);
      local_a0._4_4_ = -1.0;
      local_a0._0_4_ = drawGui_scenesTab()::leftPanelSize;
      ImGui::BeginChild("left_panel",(ImVec2 *)local_a0,true,0x10000);
      if ((long)(int)imgui_state::selectedSceneInd != -1) {
        pcVar13 = parsedData->scenes[(int)imgui_state::selectedSceneInd].name;
        local_80._0_8_ = "";
        if (pcVar13 != (char *)0x0) {
          local_80._0_8_ = pcVar13;
        }
        ppcVar16 = (char **)(ulong)(uint)scratch._size;
        local_a0 = (undefined1  [8])scratch._data;
        uStack_98 = scratch._data;
        local_90 = (uint)scratch._size;
        tl::toStringBufferT((FmtBuffer *)local_a0,imgui_state::selectedSceneInd);
        tl::fmtBufferAppend<char[3],char_const*>((tl *)local_a0,(FmtBuffer *)local_80,x,ppcVar16);
        uStack_98[-(ulong)(local_90 == 0)] = '\0';
      }
      bVar9 = ImGui::BeginCombo("scene",(char *)scratch._data,0);
      if (bVar9) {
        if (0 < (int)parsedData->scenes_count) {
          lVar27 = 0;
          lVar36 = 0;
          do {
            ImGui::PushID((void *)((long)&parsedData->scenes->name + lVar27));
            local_80._0_8_ = *(long *)((long)&parsedData->scenes->name + lVar27);
            if ((char *)local_80._0_8_ == (char *)0x0) {
              local_80._0_8_ = "";
            }
            ppcVar16 = (char **)(ulong)(uint)scratch._size;
            local_a0 = (undefined1  [8])scratch._data;
            uStack_98 = scratch._data;
            local_90 = (uint)scratch._size;
            tl::toStringBufferT((FmtBuffer *)local_a0,(uint)lVar36);
            tl::fmtBufferAppend<char[3],char_const*>
                      ((tl *)local_a0,(FmtBuffer *)local_80,x_00,ppcVar16);
            uStack_98[-(ulong)(local_90 == 0)] = '\0';
            local_a0._0_4_ = 0.0;
            local_a0._4_4_ = 0.0;
            bVar9 = ImGui::Selectable((char *)scratch._data,false,0,(ImVec2 *)local_a0);
            if (bVar9) {
              imgui_state::selectedSceneInd = (uint)lVar36;
            }
            ImGui::PopID();
            lVar36 = lVar36 + 1;
            lVar27 = lVar27 + 0x28;
          } while (lVar36 < (int)parsedData->scenes_count);
        }
        ImGui::EndCombo();
      }
      lVar27 = (long)(int)imgui_state::selectedSceneInd;
      if (lVar27 != -1) {
        pcVar1 = parsedData->scenes;
        cVar12 = pcVar1[lVar27].nodes_count;
        if (cVar12 != 0) {
          uVar33 = 0;
          do {
            if (pcVar1[lVar27].nodes[uVar33]->parent == (cgltf_node *)0x0) {
              sceneNodeGuiRecursive(pcVar1[lVar27].nodes[uVar33]);
              cVar12 = pcVar1[lVar27].nodes_count;
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 < cVar12);
        }
      }
      ImGui::EndChild();
      ImGui::SameLine(0.0,-1.0);
      local_a0._4_4_ = -1.0;
      local_a0._0_4_ = drawGui_scenesTab()::rightPanelSize;
      ImGui::BeginChild("right_panel",(ImVec2 *)local_a0,true,0);
      if (selectedNode == (cgltf_node *)0x0) {
        ImGui::Text("Nothing selected");
      }
      else {
        ImGui::Text("Node index: %ld",
                    ((long)selectedNode - (long)parsedData->nodes >> 3) * -0x7b425ed097b425ed);
        pcVar22 = selectedNode->skin;
        if (pcVar22 != (cgltf_skin *)0x0) {
          ImGui::Text("Skin: %s(%ld)",pcVar22->name,
                      ((long)pcVar22 - (long)parsedData->skins >> 3) * 0x6db6db6db6db6db7);
        }
        if (selectedNode->mesh != (cgltf_mesh *)0x0) {
          ImGui::Text("Mesh: %ld",
                      ((long)selectedNode->mesh - (long)parsedData->meshes >> 3) *
                      -0x71c71c71c71c71c7);
        }
        if (selectedNode->camera != (cgltf_camera *)0x0) {
          ImGui::Text("Camera: %ld");
        }
        if (selectedNode->light != (cgltf_light *)0x0) {
          ImGui::Text("Light: %ld");
        }
        if ((selectedNode->weights != (cgltf_float *)0x0) &&
           (bVar9 = ImGui::TreeNode(&selectedNode->weights,"Weights(%ld)",
                                    selectedNode->weights_count), bVar9)) {
          if (selectedNode->weights_count != 0) {
            uVar33 = 0;
            do {
              ImGui::Text("%g",SUB84((double)selectedNode->weights[uVar33],0));
              uVar33 = uVar33 + 1;
            } while (uVar33 < selectedNode->weights_count);
          }
          ImGui::TreePop();
        }
        if (selectedNode->has_translation != 0) {
          ImGui::Text("Translation: {%g, %g, %g}",SUB84((double)selectedNode->translation[0],0),
                      (double)selectedNode->translation[1],(double)selectedNode->translation[2]);
        }
        if (selectedNode->has_rotation != 0) {
          ImGui::Text("Rotation: {%g, %g, %g, %g}",SUB84((double)selectedNode->rotation[0],0),
                      (double)selectedNode->rotation[1],(double)selectedNode->rotation[2],
                      SUB84((double)selectedNode->rotation[3],0));
        }
        if (selectedNode->has_scale != 0) {
          ImGui::Text("Scale: {%g, %g, %g}",SUB84((double)selectedNode->scale[0],0),
                      (double)selectedNode->scale[1],(double)selectedNode->scale[2]);
        }
        if (selectedNode->has_matrix != 0) {
          ImGui::Text("Matrix: {\n  %g, %g, %g, %g,\n  %g, %g, %g, %g,\n  %g, %g, %g, %g,\n  %g, %g, %g, %g}"
                      ,SUB84((double)selectedNode->matrix[0],0),(double)selectedNode->matrix[1],
                      (double)selectedNode->matrix[2],SUB84((double)selectedNode->matrix[3],0),
                      (double)selectedNode->matrix[4],(double)selectedNode->matrix[4],
                      (double)selectedNode->matrix[6],(double)selectedNode->matrix[7]);
        }
      }
      ImGui::EndChild();
      ImGui::PopStyleVar(1);
      IVar32 = ImGui::GetWindowSize();
      drawGui_scenesTab()::leftPanelSize = drawGui_scenesTab()::leftPanelSize / IVar32.x;
      IVar32 = ImGui::GetWindowSize();
      drawGui_scenesTab()::rightPanelSize = drawGui_scenesTab()::rightPanelSize / IVar32.x;
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Meshes",(bool *)0x0,0);
    if (bVar9) {
      local_60 = (cgltf_mesh *)parsedData->meshes_count;
      if (local_60 != (cgltf_mesh *)0x0) {
        local_50 = parsedData->meshes;
        pcVar18 = (cgltf_mesh *)0x0;
        do {
          buffer_00._size._4_4_ = scratch._size._4_4_;
          buffer_00._size._0_4_ = (uint)scratch._size;
          local_a0 = (undefined1  [8])local_50[(long)pcVar18].name;
          if ((ImVec2)local_a0 == (ImVec2)0x0) {
            local_a0 = (undefined1  [8])
                       ((long)
                        "All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n"
                       + 0x4d);
          }
          buffer_00._data = (char *)scratch._data;
          local_58 = pcVar18;
          tl::toStringBuffer<unsigned_long,char[3],char_const*>
                    (buffer_00,(unsigned_long *)pcVar18,(char (*) [3])local_a0,(char **)in_R8);
          bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
          if (bVar9) {
            pcVar18 = local_50 + (long)pcVar18;
            ImGui::TreePush((void *)0x0);
            bVar9 = ImGui::TreeNode(pcVar18,"Primitives (%ld)",pcVar18->primitives_count);
            if (bVar9) {
              pcVar35 = (cgltf_buffer *)pcVar18->primitives_count;
              if (pcVar35 != (cgltf_buffer *)0x0) {
                pcVar24 = (cgltf_buffer *)0x0;
                local_68 = pcVar35;
                local_48 = pcVar18;
                do {
                  ptr_id_01 = pcVar18->primitives + (long)pcVar24;
                  bVar9 = ImGui::TreeNode(ptr_id_01,"%ld",pcVar24);
                  if (bVar9) {
                    cgltfPrimitiveTypeStr(ptr_id_01->type);
                    ImGui::Text("Type: %s");
                    pcVar23 = ptr_id_01->indices;
                    if ((pcVar23 != (cgltf_accessor *)0x0) &&
                       (bVar9 = ImGui::TreeNode(pcVar23,"Indices (accessor %ld)",
                                                ((long)pcVar23 - (long)parsedData->accessors >> 4) *
                                                -0x79435e50d79435e5), bVar9)) {
                      imguiAccessor(ptr_id_01->indices);
                      ImGui::TreePop();
                    }
                    local_80._16_8_ = pcVar24;
                    if (ptr_id_01->material == (cgltf_material *)0x0) {
                      ImGui::Text("Material: NULL");
                    }
                    else {
                      bVar9 = ImGui::TreeNode(&ptr_id_01->material,"Material (%ld)",
                                              ((long)ptr_id_01->material -
                                               (long)parsedData->materials >> 3) *
                                              0x7e3f1f8fc7e3f1f9);
                      if (bVar9) {
                        imguiMaterial(ptr_id_01->material);
                        ImGui::TreePop();
                      }
                    }
                    bVar9 = ImGui::TreeNode("Attributes");
                    if (bVar9) {
                      cVar12 = ptr_id_01->attributes_count;
                      if (cVar12 != 0) {
                        pcVar19 = ptr_id_01->attributes;
                        cVar28 = 0;
                        do {
                          bVar9 = ImGui::TreeNode(pcVar19,"%ld) %s",cVar28);
                          if (bVar9) {
                            imguiAttribute(pcVar19);
                            ImGui::TreePop();
                          }
                          cVar28 = cVar28 + 1;
                          pcVar19 = pcVar19 + 1;
                        } while (cVar12 != cVar28);
                      }
                      ImGui::TreePop();
                    }
                    if (((ptr_id_01->targets != (cgltf_morph_target *)0x0) &&
                        (bVar9 = ImGui::TreeNode("Morph targets"), bVar9)) &&
                       (local_88 = (cgltf_skin *)ptr_id_01->targets_count,
                       local_88 != (cgltf_skin *)0x0)) {
                      pcVar2 = ptr_id_01->targets;
                      pcVar22 = (cgltf_skin *)0x0;
                      do {
                        if (pcVar2[(long)pcVar22].attributes == (cgltf_attribute *)0x0) {
                          ImGui::Text("Attributes: (null)");
                        }
                        else {
                          ptr_id_02 = pcVar2 + (long)pcVar22;
                          bVar9 = ImGui::TreeNode(ptr_id_02,"Attributes");
                          if ((bVar9) && (cVar12 = ptr_id_02->attributes_count, cVar12 != 0)) {
                            pcVar19 = ptr_id_02->attributes;
                            cVar28 = 0;
                            do {
                              bVar9 = ImGui::TreeNode(pcVar19,"%ld) %s",cVar28);
                              if (bVar9) {
                                imguiAttribute(pcVar19);
                                ImGui::TreePop();
                              }
                              cVar28 = cVar28 + 1;
                              pcVar19 = pcVar19 + 1;
                            } while (cVar12 != cVar28);
                          }
                        }
                        pcVar22 = (cgltf_skin *)((long)&pcVar22->name + 1);
                      } while (pcVar22 != local_88);
                    }
                    ImGui::TreePop();
                    pcVar24 = (cgltf_buffer *)local_80._16_8_;
                    pcVar35 = local_68;
                    pcVar18 = local_48;
                  }
                  pcVar24 = (cgltf_buffer *)((long)&pcVar24->size + 1);
                } while (pcVar24 != pcVar35);
              }
              ImGui::TreePop();
            }
            ImGui::TreePop();
          }
          pcVar18 = (cgltf_mesh *)((long)&local_58->name + 1);
        } while (pcVar18 != local_60);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Textures",(bool *)0x0,0);
    if (bVar9) {
      pcVar3 = parsedData->textures;
      IVar32 = (ImVec2)parsedData->textures_count;
      buffer_01._size._4_4_ = scratch._size._4_4_;
      buffer_01._size._0_4_ = (uint)scratch._size;
      buffer_01._data = (char *)scratch._data;
      local_a0 = (undefined1  [8])IVar32;
      tl::toStringBuffer<char[11],unsigned_long,char[2]>
                (buffer_01,(char (*) [11])"Textures (",(unsigned_long *)local_a0,in_R8);
      bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
      if (IVar32 != (ImVec2)0x0 && bVar9) {
        ptr_id_03 = &pcVar3->sampler;
        x_03.x = 0.0;
        x_03.y = 0.0;
        do {
          buffer_02._size._4_4_ = scratch._size._4_4_;
          buffer_02._size._0_4_ = (uint)scratch._size;
          local_a0 = (undefined1  [8])((cgltf_texture *)(ptr_id_03 + -2))->name;
          if ((ImVec2)local_a0 == (ImVec2)0x0) {
            local_a0 = (undefined1  [8])
                       ((long)
                        "All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n"
                       + 0x4d);
          }
          buffer_02._data = (char *)scratch._data;
          tl::toStringBuffer<unsigned_long,char[3],char_const*>
                    (buffer_02,(unsigned_long *)x_03,(char (*) [3])local_a0,(char **)in_R8);
          bVar9 = ImGui::TreeNode((cgltf_texture *)(ptr_id_03 + -2),"%s",scratch._data);
          if (bVar9) {
            if ((cgltf_image *)ptr_id_03[-1] == (cgltf_image *)0x0) {
              ImGui::Text("image: (null)");
            }
            else {
              bVar9 = ImGui::TreeNode(ptr_id_03 + -1,"image");
              if (bVar9) {
                pcVar20 = (cgltf_image *)ptr_id_03[-1];
                lVar27 = (long)pcVar20 - (long)parsedData->images >> 4;
                ImGui::Text("Name: %s",pcVar20->name);
                ImGui::Text("File path: %s",pcVar20->uri);
                ImGui::Text("MIME Type: %s",pcVar20->mime_type);
                ImGui::Text("Size: %dx%d",
                            (ulong)*(uint *)(&gpu::textureSizes + lVar27 * 0xaaaaaaaaaaaaaab),
                            (ulong)*(uint *)((long)&gpu::textureSizes +
                                            lVar27 * 0x5555555555555558 + 4));
                imguiTexture(lVar27 * -0x5555555555555555,
                             (float *)(&imgui_state::textureHeights + lVar27 * -0x1555555555555555))
                ;
                ImGui::TreePop();
              }
            }
            if (*ptr_id_03 == (cgltf_sampler *)0x0) {
              ImGui::Text("sampler: (null)");
            }
            else {
              bVar9 = ImGui::TreeNode(ptr_id_03,"sampler");
              if (bVar9) {
                pcVar21 = *ptr_id_03;
                pcVar13 = glMinFilterModeStr(pcVar21->min_filter);
                ImGui::Text("Min filter: %s",pcVar13);
                pcVar13 = glMinFilterModeStr(pcVar21->mag_filter);
                ImGui::Text("Mag filter: %s",pcVar13);
                pcVar13 = glTextureWrapModeStr(pcVar21->wrap_s);
                ImGui::Text("Wrap mode S: %s",pcVar13);
                pcVar13 = glTextureWrapModeStr(pcVar21->wrap_t);
                ImGui::Text("Wrap mode T: %s",pcVar13);
                ImGui::TreePop();
              }
            }
            ImGui::TreePop();
          }
          x_03 = (ImVec2)((long)x_03 + 1);
          ptr_id_03 = ptr_id_03 + 5;
        } while (IVar32 != x_03);
      }
      pcVar20 = parsedData->images;
      buffer = (FmtBuffer *)parsedData->images_count;
      xs = (char (*) [2])(ulong)(uint)scratch._size;
      local_a0 = (undefined1  [8])scratch._data;
      uStack_98 = scratch._data;
      local_90 = (uint)scratch._size;
      tl::CStrT<char>::CStrT((CStrT<char> *)local_80,"Images (");
      str_01._str = *xs;
      str_01._0_8_ = local_80._8_8_;
      tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(local_80._0_8_ & 0xffffffff),str_01);
      tl::fmtBufferAppend<unsigned_long,char[2]>((tl *)local_a0,buffer,x_01,xs);
      uStack_98[-(ulong)(local_90 == 0)] = '\0';
      bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
      if (buffer != (FmtBuffer *)0x0 && bVar9) {
        pFVar31 = (FmtBuffer *)0x0;
        ptr_id_05 = pcVar20;
        do {
          bVar9 = ImGui::TreeNode(ptr_id_05,"%ld",pFVar31);
          if (bVar9) {
            lVar27 = (long)pcVar20 - (long)parsedData->images >> 4;
            ImGui::Text("Name: %s",ptr_id_05->name);
            ImGui::Text("File path: %s",ptr_id_05->uri);
            ImGui::Text("MIME Type: %s",ptr_id_05->mime_type);
            ImGui::Text("Size: %dx%d",
                        (ulong)*(uint *)(&gpu::textureSizes + lVar27 * 0xaaaaaaaaaaaaaab),
                        (ulong)*(uint *)((long)&gpu::textureSizes + lVar27 * 0x5555555555555558 + 4)
                       );
            imguiTexture(lVar27 * -0x5555555555555555,
                         (float *)(&imgui_state::textureHeights + lVar27 * -0x1555555555555555));
            ImGui::TreePop();
          }
          pFVar31 = (FmtBuffer *)((long)&pFVar31->start + 1);
          ptr_id_05 = ptr_id_05 + 1;
          pcVar20 = pcVar20 + 1;
        } while (buffer != pFVar31);
      }
      pcVar21 = parsedData->samplers;
      IVar32 = (ImVec2)parsedData->samplers_count;
      buffer_03._size._4_4_ = scratch._size._4_4_;
      buffer_03._size._0_4_ = (uint)scratch._size;
      buffer_03._data = (char *)scratch._data;
      local_a0 = (undefined1  [8])IVar32;
      tl::toStringBuffer<char[11],unsigned_long,char[2]>
                (buffer_03,(char (*) [11])"Samplers (",(unsigned_long *)local_a0,in_R8);
      bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
      if (IVar32 != (ImVec2)0x0 && bVar9) {
        IVar37.x = 0.0;
        IVar37.y = 0.0;
        do {
          bVar9 = ImGui::TreeNode(pcVar21,"%ld",IVar37);
          if (bVar9) {
            pcVar13 = glMinFilterModeStr(pcVar21->min_filter);
            ImGui::Text("Min filter: %s",pcVar13);
            pcVar13 = glMinFilterModeStr(pcVar21->mag_filter);
            ImGui::Text("Mag filter: %s",pcVar13);
            pcVar13 = glTextureWrapModeStr(pcVar21->wrap_s);
            ImGui::Text("Wrap mode S: %s",pcVar13);
            glTextureWrapModeStr(pcVar21->wrap_t);
            ImGui::Text("Wrap mode T: %s");
            ImGui::TreePop();
          }
          IVar37 = (ImVec2)((long)IVar37 + 1);
          pcVar21 = pcVar21 + 1;
        } while (IVar32 != IVar37);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Buffers",(bool *)0x0,0);
    if (bVar9) {
      local_88 = (cgltf_skin *)parsedData->buffers_count;
      if (local_88 != (cgltf_skin *)0x0) {
        pcVar35 = parsedData->buffers;
        pcVar22 = (cgltf_skin *)0x0;
        local_80._16_8_ = pcVar35;
        do {
          uVar33 = pcVar35[(long)pcVar22].size;
          if ((drawGui_buffersTab()::unitsStrs == '\0') &&
             (iVar10 = __cxa_guard_acquire(&drawGui_buffersTab()::unitsStrs), iVar10 != 0)) {
            tl::CStrT<char>::CStrT((CStrT<char> *)drawGui_buffersTab()::unitsStrs,"bytes");
            tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x10),"KB");
            tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x20),"MB");
            tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x30),"GB");
            __cxa_guard_release(&drawGui_buffersTab()::unitsStrs);
          }
          lVar27 = 0;
          uVar25 = uVar33;
          if (0x400 < uVar33) {
            do {
              uVar33 = uVar25 >> 10;
              lVar27 = lVar27 + 1;
              bVar9 = 0x1003ff < uVar25;
              uVar25 = uVar33;
            } while (bVar9);
          }
          pcVar13 = pcVar35[(long)pcVar22].uri;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = "";
          }
          local_a0 = (undefined1  [8])scratch._data;
          uStack_98 = scratch._data;
          local_90 = (uint)scratch._size;
          puVar17 = scratch._data;
          tl::toStringBufferT((FmtBuffer *)local_a0,(u64)pcVar22);
          tl::CStrT<char>::CStrT((CStrT<char> *)local_80,") ");
          str_02._str = (char *)puVar17;
          str_02._0_8_ = local_80._8_8_;
          tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(local_80._0_8_ & 0xffffffff),str_02);
          tl::CStrT<char>::CStrT((CStrT<char> *)local_80,pcVar13);
          str_03._str = (char *)puVar17;
          str_03._0_8_ = local_80._8_8_;
          tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(local_80._0_8_ & 0xffffffff),str_03);
          tl::toStringBufferT((FmtBuffer *)local_a0,uVar33);
          str_04._str = (char *)puVar17;
          str_04._0_8_ = *(undefined8 *)(drawGui_buffersTab()::unitsStrs + lVar27 * 0x10 + 8);
          tl::toStringBufferT((tl *)local_a0,
                              (FmtBuffer *)
                              (ulong)*(uint *)(drawGui_buffersTab()::unitsStrs + lVar27 * 0x10),
                              str_04);
          pcVar35 = (cgltf_buffer *)local_80._16_8_;
          uStack_98[-(ulong)(local_90 == 0)] = '\0';
          ImGui::CollapsingHeader((char *)scratch._data,0);
          pcVar22 = (cgltf_skin *)((long)&pcVar22->name + 1);
        } while (pcVar22 != local_88);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("BufferViews",(bool *)0x0,0);
    if (bVar9) {
      cVar12 = parsedData->buffer_views_count;
      if (cVar12 != 0) {
        pcVar29 = &parsedData->buffer_views->type;
        uVar34 = 0;
        do {
          local_a0 = (undefined1  [8])scratch._data;
          uStack_98 = scratch._data;
          local_90 = (uint)scratch._size;
          tl::toStringBufferT((FmtBuffer *)local_a0,uVar34);
          uStack_98[-(ulong)(local_90 == 0)] = '\0';
          bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
          if (bVar9) {
            ImGui::TreePush((void *)0x0);
            ImGui::Text("Type: %s",
                        _ZZL22drawGui_bufferViewsTabvE8typeStrs_rel +
                        *(int *)(_ZZL22drawGui_bufferViewsTabvE8typeStrs_rel + (ulong)*pcVar29 * 4))
            ;
            ImGui::Text("Offset: %ld bytes",*(cgltf_size *)(pcVar29 + -6));
            ImGui::Text("Size: %ld bytes",*(cgltf_size *)(pcVar29 + -4));
            ImGui::Text("Stride: %ld bytes",*(cgltf_size *)(pcVar29 + -2));
            ImGui::Text("Buffer: %ld");
            ImGui::TreePop();
          }
          uVar34 = uVar34 + 1;
          pcVar29 = pcVar29 + 0xe;
        } while (cVar12 != uVar34);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Accessors",(bool *)0x0,0);
    if (bVar9) {
      cVar12 = parsedData->accessors_count;
      if (cVar12 != 0) {
        pcVar23 = parsedData->accessors;
        uVar34 = 0;
        do {
          local_a0 = (undefined1  [8])scratch._data;
          uStack_98 = scratch._data;
          local_90 = (uint)scratch._size;
          tl::toStringBufferT((FmtBuffer *)local_a0,uVar34);
          uStack_98[-(ulong)(local_90 == 0)] = '\0';
          bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
          if (bVar9) {
            ImGui::TreePush((void *)0x0);
            imguiAccessor(pcVar23);
            ImGui::TreePop();
          }
          uVar34 = uVar34 + 1;
          pcVar23 = pcVar23 + 1;
        } while (cVar12 != uVar34);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Materials",(bool *)0x0,0);
    if (bVar9) {
      puVar4 = (unsigned_long *)parsedData->materials_count;
      if (puVar4 != (unsigned_long *)0x0) {
        material = parsedData->materials;
        x_04 = (unsigned_long *)0x0;
        do {
          buffer_04._size._4_4_ = scratch._size._4_4_;
          buffer_04._size._0_4_ = (uint)scratch._size;
          local_a0 = (undefined1  [8])material->name;
          if ((ImVec2)local_a0 == (ImVec2)0x0) {
            local_a0 = (undefined1  [8])
                       ((long)
                        "All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n"
                       + 0x4d);
          }
          buffer_04._data = (char *)scratch._data;
          tl::toStringBuffer<unsigned_long,char[3],char_const*>
                    (buffer_04,x_04,(char (*) [3])local_a0,(char **)in_R8);
          bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
          if (bVar9) {
            ImGui::TreePush((void *)0x0);
            imguiMaterial(material);
            ImGui::TreePop();
          }
          x_04 = (unsigned_long *)((long)x_04 + 1);
          material = material + 1;
        } while (puVar4 != x_04);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Skins",(bool *)0x0,0);
    if (bVar9) {
      pcVar35 = (cgltf_buffer *)parsedData->skins_count;
      if (pcVar35 != (cgltf_buffer *)0x0) {
        pcVar22 = parsedData->skins;
        pcVar24 = (cgltf_buffer *)0x0;
        local_88 = pcVar22;
        local_80._16_8_ = pcVar35;
        do {
          pcVar38 = pcVar22 + (long)pcVar24;
          bVar9 = ImGui::TreeNode(pcVar38,"%ld) %s",pcVar24);
          if (bVar9) {
            ptr_id_00 = pcVar38->joints;
            cVar12 = pcVar38->joints_count;
            bVar9 = ImGui::TreeNode(ptr_id_00,"joints(%ld)",cVar12);
            if (bVar9) {
              if (cVar12 != 0) {
                cVar28 = 0;
                do {
                  pcVar5 = ptr_id_00[cVar28];
                  if (pcVar5 == pcVar38->skeleton) {
                    ImGui::PushStyleColor(0,0xff0000ff);
                  }
                  ImGui::Text("%ld) %ld %s",cVar28,
                              ((long)pcVar5 - (long)parsedData->nodes >> 3) * -0x7b425ed097b425ed);
                  if (pcVar5 == pcVar38->skeleton) {
                    ImGui::PopStyleColor(1);
                  }
                  cVar28 = cVar28 + 1;
                } while (cVar12 != cVar28);
              }
              ImGui::TreePop();
              pcVar35 = (cgltf_buffer *)local_80._16_8_;
            }
            ImGui::TreePop();
            pcVar22 = local_88;
          }
          pcVar24 = (cgltf_buffer *)((long)&pcVar24->size + 1);
        } while (pcVar24 != pcVar35);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Animations",(bool *)0x0,0);
    if (bVar9) {
      local_50 = (cgltf_mesh *)parsedData->animations_count;
      if (local_50 != (cgltf_mesh *)0x0) {
        pcVar18 = (cgltf_mesh *)parsedData->animations;
        x_02 = (cgltf_mesh *)0x0;
        local_60 = pcVar18;
        do {
          pcVar35 = (cgltf_buffer *)((long)x_02 * 0x38);
          buffer_05._size._4_4_ = scratch._size._4_4_;
          buffer_05._size._0_4_ = (uint)scratch._size;
          local_a0 = *(undefined1 (*) [8])((long)&pcVar35->size + (long)&pcVar18->name);
          if ((ImVec2)local_a0 == (ImVec2)0x0) {
            local_a0 = (undefined1  [8])((long)"image: (null)" + 7);
          }
          buffer_05._data = (char *)scratch._data;
          tl::toStringBuffer<unsigned_long,char[3],char_const*>
                    (buffer_05,(unsigned_long *)x_02,(char (*) [3])local_a0,(char **)in_R8);
          bVar9 = ImGui::CollapsingHeader((char *)scratch._data,0);
          if (bVar9) {
            ImGui::TreePush((void *)0x0);
            local_58 = x_02;
            if (x_02 == (cgltf_mesh *)((long)(int)anims::playingInd + -1)) {
              local_a0._0_4_ = 0.0;
              local_a0._4_4_ = 0.0;
              bVar9 = ImGui::Button(anon_var_dwarf_a4f7,(ImVec2 *)local_a0);
              if (bVar9) {
                anims::playingInd = -anims::playingInd;
              }
            }
            else {
              local_a0._0_4_ = 0.0;
              local_a0._4_4_ = 0.0;
              bVar9 = ImGui::Button(anon_var_dwarf_a532,(ImVec2 *)local_a0);
              if (bVar9) {
                if (-1 < (int)anims::playingInd || x_02 != (cgltf_mesh *)(ulong)~anims::playingInd)
                {
                  anims::time = 0.0;
                }
                anims::playingInd = (int)x_02 + 1;
                tl::Vector<anims::NodeData>::resize<>
                          ((Vector<anims::NodeData> *)&anims::nodesData,parsedData->nodes_count);
                pcVar8 = parsedData;
                memset(anims::nodesData,0,parsedData->nodes_count * 0x18);
                pcVar6 = pcVar8->animations;
                local_a0._0_4_ = 0.0;
                local_a0._4_4_ = 0.0;
                local_68 = pcVar35;
                if (0 < (int)anims::playingInd) {
                  uVar33 = (ulong)(anims::playingInd - 1);
                  if (pcVar8->animations_count <= uVar33) {
                    __assert_fail("i < _size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/span.hpp"
                                  ,0x51,
                                  "T &tl::Span<const cgltf_animation>::operator[](size_t) [T = const cgltf_animation]"
                                 );
                  }
                  cVar12 = pcVar6[uVar33].channels_count;
                  if (cVar12 != 0) {
                    pcVar7 = pcVar6[uVar33].channels;
                    lVar27 = 0;
                    do {
                      advanceAnimPathOffset
                                ((size_t *)local_a0,
                                 *(cgltf_animation_path_type *)((long)&pcVar7->target_path + lVar27)
                                );
                      lVar27 = lVar27 + 0x28;
                    } while (cVar12 * 0x28 != lVar27);
                  }
                }
                tl::Vector<float>::resize<>((Vector<float> *)anims::animData,(size_t)local_a0);
                local_80._0_8_ = (char *)0x0;
                lVar27 = (long)(int)anims::playingInd;
                pcVar35 = local_68;
                if (0 < lVar27) {
                  pcVar6 = parsedData->animations;
                  tl::Vector<int>::resize<>
                            ((Vector<int> *)&anims::curKeyInds,pcVar6[lVar27 + -1].samplers_count);
                  if (DAT_003e8970 != 0) {
                    memset(anims::curKeyInds,0xff,DAT_003e8970 << 2);
                  }
                  cVar12 = pcVar6[lVar27 + -1].channels_count;
                  if (cVar12 != 0) {
                    pcVar7 = pcVar6[lVar27 + -1].channels;
                    lVar36 = 0;
                    do {
                      lVar14 = *(long *)((long)&pcVar7->target_node + lVar36) -
                               (long)parsedData->nodes >> 3;
                      uVar33 = lVar14 * -0x7b425ed097b425ed;
                      t = *(cgltf_animation_path_type *)((long)&pcVar7->target_path + lVar36);
                      if (t == cgltf_animation_path_type_scale) {
                        if ((ulong)anims::animData._8_8_ <= (ulong)local_80._0_8_)
                        goto LAB_00118043;
                        if (DAT_003e8928 <= uVar33) goto LAB_0011802c;
                        *(long *)((long)anims::nodesData + lVar14 * 0x71c71c71c71c71c8 + 0x10) =
                             local_80._0_8_ * 4 + anims::animData._0_8_;
                      }
                      else if (t == cgltf_animation_path_type_rotation) {
                        if ((ulong)anims::animData._8_8_ <= (ulong)local_80._0_8_)
                        goto LAB_00118043;
                        if (DAT_003e8928 <= uVar33) goto LAB_0011802c;
                        *(long *)((long)anims::nodesData + lVar14 * 0x71c71c71c71c71c8 + 8) =
                             local_80._0_8_ * 4 + anims::animData._0_8_;
                      }
                      else {
                        if (t != cgltf_animation_path_type_translation) {
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                        ,0x1a4,"void anims::initAnim()");
                        }
                        if ((ulong)anims::animData._8_8_ <= (ulong)local_80._0_8_) {
LAB_00118043:
                          pcVar13 = "T &tl::Vector<float>::operator[](size_t) [T = float]";
LAB_00118058:
                          __assert_fail("i < _size",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                                        ,0x2c,pcVar13);
                        }
                        if (DAT_003e8928 <= uVar33) {
LAB_0011802c:
                          pcVar13 = 
                          "T &tl::Vector<anims::NodeData>::operator[](size_t) [T = anims::NodeData]"
                          ;
                          goto LAB_00118058;
                        }
                        *(long *)((long)anims::nodesData + lVar14 * 0x71c71c71c71c71c8) =
                             local_80._0_8_ * 4 + anims::animData._0_8_;
                      }
                      advanceAnimPathOffset((size_t *)local_80,t);
                      lVar36 = lVar36 + 0x28;
                    } while (cVar12 * 0x28 != lVar36);
                  }
                  anims::duration = 0.0;
                  x_02 = local_58;
                  pcVar18 = local_60;
                  pcVar35 = local_68;
                  if (pcVar6[lVar27 + -1].samplers_count != 0) {
                    lVar36 = 0;
                    do {
                      lVar14 = *(long *)((long)&(pcVar6[lVar27 + -1].samplers)->input + lVar36);
                      if (*(int *)(lVar14 + 0x74) == 0) {
                        __assert_fail("sampler.input->has_max",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                      ,0x1ac,"void anims::initAnim()");
                      }
                      fVar40 = *(float *)(lVar14 + 0x78);
                      if (fVar40 <= anims::duration) {
                        fVar40 = anims::duration;
                      }
                      lVar36 = lVar36 + 0x28;
                      anims::duration = fVar40;
                    } while (pcVar6[lVar27 + -1].samplers_count * 0x28 != lVar36);
                  }
                }
              }
            }
            ImGui::SameLine(0.0,-1.0);
            local_a0._0_4_ = 0.0;
            local_a0._4_4_ = 0.0;
            bVar9 = ImGui::Button(anon_var_dwarf_a53d,(ImVec2 *)local_a0);
            if (bVar9) {
              anims::playingInd = 0;
              anims::time = 0.0;
              uVar39 = 0;
            }
            else {
              uVar39 = SUB84((double)anims::time,0);
            }
            pcVar35 = (cgltf_buffer *)((long)&pcVar18->name + (long)&pcVar35->size);
            ImGui::Text("time: %g / %g",uVar39,(double)anims::duration);
            ptr_id = &pcVar35->extras;
            bVar9 = ImGui::TreeNode(ptr_id,"channels");
            local_68 = pcVar35;
            if (bVar9) {
              if ((pcVar35->extras).end_offset != 0) {
                lVar27 = 0x10;
                uVar34 = 0;
                do {
                  cVar12 = ptr_id->start_offset;
                  local_a0 = (undefined1  [8])scratch._data;
                  uStack_98 = scratch._data;
                  local_90 = (uint)scratch._size;
                  tl::toStringBufferT((FmtBuffer *)local_a0,uVar34);
                  uStack_98[-(ulong)(local_90 == 0)] = '\0';
                  bVar9 = ImGui::TreeNode((char *)scratch._data);
                  if (bVar9) {
                    lVar36 = *(long *)((cVar12 - 0x10) + lVar27);
                    puVar30 = *(undefined8 **)((cVar12 - 8) + lVar27);
                    pcVar13 = pcVar35->uri;
                    ImGui::Text("target node: %d) %s",
                                (ulong)(uint)((int)((ulong)((long)puVar30 - (long)parsedData->nodes)
                                                   >> 3) * 0x684bda13),*puVar30);
                    pcVar15 = cgltfAnimationPathStr(*(cgltf_animation_path_type *)(cVar12 + lVar27))
                    ;
                    ImGui::Text("target path: %s",pcVar15);
                    pcVar35 = local_68;
                    ImGui::Text("sampler: %d",
                                (ulong)(uint)((int)((ulong)(lVar36 - (long)pcVar13) >> 3) *
                                             -0x33333333));
                    ImGui::TreePop();
                  }
                  uVar34 = uVar34 + 1;
                  lVar27 = lVar27 + 0x28;
                } while (uVar34 < (pcVar35->extras).end_offset);
              }
              ImGui::TreePop();
              x_02 = local_58;
              pcVar18 = local_60;
            }
            local_48 = (cgltf_mesh *)&pcVar35->uri;
            bVar9 = ImGui::TreeNode(local_48,"samplers");
            if (bVar9) {
              if (pcVar35->data != (void *)0x0) {
                pcVar24 = (cgltf_buffer *)0x0;
                do {
                  IVar32 = (ImVec2)((long)pcVar24 * 0x28 + (long)local_48->name);
                  local_a0 = (undefined1  [8])scratch._data;
                  uStack_98 = scratch._data;
                  local_90 = (uint)scratch._size;
                  local_80._16_8_ = pcVar24;
                  tl::toStringBufferT((FmtBuffer *)local_a0,(u64)pcVar24);
                  uStack_98[-(ulong)(local_90 == 0)] = '\0';
                  bVar9 = ImGui::TreeNode((char *)scratch._data);
                  if (bVar9) {
                    pcVar13 = cgltfInterpolationStr
                                        (*(cgltf_interpolation_type *)((long)IVar32 + 0x10));
                    ImGui::Text("interpolation type: %s",pcVar13);
                    pcVar13 = cgltfComponentTypeStr(**(cgltf_component_type **)IVar32);
                    ImGui::Text("Input compType: %s",pcVar13);
                    local_a0._0_4_ = -1.0;
                    local_a0._4_4_ = 0.0;
                    in_R8 = (char (*) [2])0x0;
                    bVar9 = ImPlot::BeginPlot("","t",(char *)0x0,(ImVec2 *)local_a0,0,0,0,2,2,
                                              (char *)0x0,(char *)0x0);
                    if (bVar9) {
                      uStack_98 = (u8 *)((ulong)uStack_98 & 0xffffffff00000000);
                      local_a0 = (undefined1  [8])IVar32;
                      uVar11 = cgltfTypeNumComponents
                                         (*(cgltf_type *)(*(long *)((long)IVar32 + 8) + 8));
                      if (uVar11 - 1 < 4) {
                        local_88 = (cgltf_skin *)(ulong)uVar11;
                        puVar30 = &DAT_003de0b0;
                        pcVar22 = (cgltf_skin *)0x0;
                        do {
                          uStack_98 = (u8 *)CONCAT44(uStack_98._4_4_,(int)pcVar22);
                          pcVar13 = (char *)*puVar30;
                          ImPlot::PlotLineG(pcVar13,sampleAnimDataForPlotting,(FmtBuffer *)local_a0,
                                            *(int *)(*(long *)IVar32 + 0x18),0);
                          in_R8 = (char (*) [2])0x0;
                          ImPlot::PlotScatterG
                                    (pcVar13,sampleAnimDataForPlotting,(FmtBuffer *)local_a0,
                                     *(int *)(*(long *)IVar32 + 0x18),0);
                          pcVar22 = (cgltf_skin *)((long)&pcVar22->name + 1);
                          puVar30 = puVar30 + 1;
                        } while (local_88 != pcVar22);
                      }
                      ImPlot::EndPlot();
                      x_02 = local_58;
                      pcVar35 = local_68;
                    }
                    ImGui::TreePop();
                  }
                  pcVar24 = (cgltf_buffer *)((long)(cgltf_size *)local_80._16_8_ + 1);
                } while (pcVar24 < (cgltf_buffer *)pcVar35->data);
              }
              ImGui::TreePop();
              pcVar18 = local_60;
            }
            ImGui::TreePop();
          }
          x_02 = (cgltf_mesh *)((long)&x_02->name + 1);
        } while (x_02 != local_50);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Cameras",(bool *)0x0,0);
    if (bVar9) {
      ptr_id_04 = parsedData->cameras;
      pcVar22 = (cgltf_skin *)parsedData->cameras_count;
      bVar9 = ImGui::BeginCombo("Use camera","[DEFAULT ORBIT]",0);
      if (bVar9) {
        if (-1 < (long)pcVar22) {
          pcVar38 = (cgltf_skin *)0xffffffffffffffff;
          local_88 = pcVar22;
          do {
            ImGui::PushID(pcVar38);
            pcVar13 = "[DEFAULT ORBIT]";
            uVar11 = (uint)pcVar38;
            if (-1 < (int)uVar11) {
              if ((int)parsedData->cameras_count <= (int)uVar11) {
                __assert_fail("ind < (int)parsedData->cameras_count",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                              ,0x16a,"const char *getCameraName(int)");
              }
              pcVar13 = parsedData->cameras[uVar11 & 0x7fffffff].name;
              if (pcVar13 == (char *)0x0) {
                pcVar13 = "(null)";
              }
              pcVar15 = (char *)(ulong)(uint)scratch._size;
              local_a0 = (undefined1  [8])scratch._data;
              uStack_98 = scratch._data;
              local_90 = (uint)scratch._size;
              tl::CStrT<char>::CStrT((CStrT<char> *)local_80,"%d) %s");
              str_05._str = pcVar15;
              str_05._0_8_ = local_80._8_8_;
              tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(local_80._0_8_ & 0xffffffff),str_05);
              tl::CStrT<char>::CStrT((CStrT<char> *)local_80,pcVar13);
              str_06._str = pcVar15;
              str_06._0_8_ = local_80._8_8_;
              tl::toStringBufferT((tl *)local_a0,(FmtBuffer *)(local_80._0_8_ & 0xffffffff),str_06);
              uStack_98[-(ulong)(local_90 == 0)] = '\0';
              pcVar13 = (char *)scratch._data;
              pcVar22 = local_88;
            }
            local_a0._0_4_ = 0.0;
            local_a0._4_4_ = 0.0;
            bVar9 = ImGui::Selectable(pcVar13,false,0,(ImVec2 *)local_a0);
            if (bVar9) {
              imgui_state::selectedSceneInd = uVar11;
            }
            ImGui::PopID();
            pcVar38 = (cgltf_skin *)((long)&pcVar38->name + 1);
          } while (pcVar22 != pcVar38);
        }
        ImGui::EndCombo();
      }
      bVar9 = ImGui::CollapsingHeader("Cameras",0);
      if (pcVar22 != (cgltf_skin *)0x0 && bVar9) {
        pcVar38 = (cgltf_skin *)0x0;
        do {
          bVar9 = ImGui::TreeNode(ptr_id_04,"%ld) %s",pcVar38);
          if (bVar9) {
            ImGui::Text("Name: %s",ptr_id_04->name);
            cgltfCameraTypeStr(ptr_id_04->type);
            ImGui::Text("Type: %s");
            if (ptr_id_04->type == cgltf_camera_type_orthographic) {
              ImGui::Text("SizeXY: %g x %g",
                          SUB84((double)(ptr_id_04->data).perspective.aspect_ratio,0),
                          (double)(ptr_id_04->data).perspective.yfov);
LAB_00117ce8:
              ImGui::Text("Near: %g",SUB84((double)(ptr_id_04->data).perspective.znear,0));
              ImGui::Text("Far: %g",SUB84((double)(ptr_id_04->data).perspective.zfar,0));
            }
            else if (ptr_id_04->type == cgltf_camera_type_perspective) {
              ImGui::Text("Aspect ratio: %g",
                          SUB84((double)(ptr_id_04->data).perspective.aspect_ratio,0));
              ImGui::Text("Fov Y: %g",SUB84((double)(ptr_id_04->data).perspective.yfov,0));
              goto LAB_00117ce8;
            }
            ImGui::TreePop();
          }
          pcVar38 = (cgltf_skin *)((long)&pcVar38->name + 1);
          ptr_id_04 = ptr_id_04 + 1;
        } while (pcVar22 != pcVar38);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Lights",(bool *)0x0,0);
    if (bVar9) {
      cVar12 = parsedData->lights_count;
      if (cVar12 != 0) {
        pcVar26 = &parsedData->lights->spot_outer_cone_angle;
        cVar28 = 0;
        do {
          bVar9 = ImGui::TreeNode(&parsedData->lights,"%ld) %s",cVar28);
          if (bVar9) {
            ImGui::Text("Name: %s",((cgltf_light *)(pcVar26 + -9))->name);
            ImGui::Text("Color: ");
            ImGui::SameLine(0.0,-1.0);
            IVar32 = *(ImVec2 *)(pcVar26 + -7);
            local_a0 = *(undefined1 (*) [8])(pcVar26 + -7);
            uStack_98 = (u8 *)CONCAT44(0x3f800000,pcVar26[-5]);
            ImGui::TextColored((ImVec4 *)local_a0,"(%g, %g, %g)",SUB84((double)IVar32.x,0),
                               (double)IVar32.y,(double)pcVar26[-5]);
            ImGui::Text("Intensity: %g",SUB84((double)pcVar26[-4],0));
            ImGui::Text("Range: %g",SUB84((double)pcVar26[-2],0));
            if (3 < (uint)pcVar26[-3]) {
              __assert_fail("(size_t)light.type < tl::size(lightTypeStrs)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                            ,0x302,"void imguiLight(const cgltf_light &)");
            }
            ImGui::Text("Type: %s");
            if (pcVar26[-3] == 4.2039e-45) {
              ImGui::Text("Inner cone angle: %g",SUB84((double)pcVar26[-1],0));
              ImGui::Text("Outer cone angle: %g",SUB84((double)*pcVar26,0));
            }
            ImGui::TreePop();
          }
          cVar28 = cVar28 + 1;
          pcVar26 = pcVar26 + 10;
        } while (cVar12 != cVar28);
      }
      ImGui::EndTabItem();
    }
    bVar9 = ImGui::BeginTabItem("Options",(bool *)0x0,0);
    if (bVar9) {
      bVar9 = ImGui::TreeNode("Orbit camera");
      if (bVar9) {
        ImGui::SliderFloat("Near",&camProjInfo.nearDist,0.0001,0.5,"%.3f",0);
        ImGui::SliderFloat("Far",&camProjInfo.farDist,camProjInfo.nearDist,100000.0,"%.3f",3);
        if (camProjInfo.farDist <= camProjInfo.nearDist + camProjInfo.nearDist) {
          camProjInfo.farDist = camProjInfo.nearDist + camProjInfo.nearDist;
        }
        ImGui::SliderAngle("FOV Y",&camProjInfo.fovY,1.0,175.0,"%.0f deg",0);
        ImGui::TreePop();
      }
      ImGui::Checkbox("Show axes",(bool *)&imgui_state::showAxes);
      ImGui::Checkbox("Show floor grid",(bool *)&imgui_state::showFloorGrid);
      ImGui::Checkbox("Show crosshair",(bool *)&imgui_state::showCrosshair);
      ImGui::SliderFloat("Crosshair scale",(float *)&imgui_state::crosshairScale,0.0,0.1,"%.3f",0);
      ImGui::EndTabItem();
    }
    ImGui::EndTabBar();
  }
  ImGui::End();
  return;
}

Assistant:

void drawGui()
{
    if(!parsedData) {
        ImGui::Begin("drag & drop a glTF file##0");
        ImGui::End();
        return;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(1,1));
    tl::toStringBuffer(scratchStr(), openedFilePath, "##0");
    ImGui::Begin(scratchStr());
    ImGui::PopStyleVar();

    if (ImGui::BeginTabBar("TopTabBar"))
    {
        if (ImGui::BeginTabItem("Scenes")) {
            drawGui_scenesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Meshes")) {
            drawGui_meshesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Textures")) {
            drawGui_texturesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Buffers")) {
            drawGui_buffersTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("BufferViews")) {
            drawGui_bufferViewsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Accessors")) {
            drawGui_accessorsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Materials")) {
            drawGui_materialsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Skins")) {
            drawGui_skins();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Animations")) {
            drawGui_animations();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Cameras")) {
            drawGui_cameras();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Lights")) {
            drawGui_lights();
            ImGui::EndTabItem();
        }

        if(ImGui::BeginTabItem("Options")) {
            drawGui_options();
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}